

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O1

bool __thiscall Snake::SnakeCell(Snake *this,int x,int y)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  bool bVar4;
  
  if (((int)*(float *)(this + 0x10) != x) || (bVar4 = true, (int)*(float *)(this + 0x14) != y)) {
    piVar1 = *(int **)(this + 0x18);
    piVar2 = *(int **)(this + 0x20);
    bVar4 = piVar1 != piVar2;
    if ((bVar4) && ((*piVar1 != x || (piVar1[1] != y)))) {
      piVar1 = piVar1 + 2;
      do {
        piVar3 = piVar1;
        bVar4 = piVar3 != piVar2;
        if (piVar3 == piVar2) {
          return bVar4;
        }
        piVar1 = piVar3 + 2;
      } while ((*piVar3 != x) || (piVar3[1] != y));
    }
  }
  return bVar4;
}

Assistant:

bool Snake::SnakeCell(int x, int y) {
  if (x == static_cast<int>(head_x) && y == static_cast<int>(head_y)) {
    return true;
  }
  for (auto const &item : body) {
    if (x == item.x && y == item.y) {
      return true;
    }
  }
  return false;
}